

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O0

bool bssl::ssl_ech_accept_confirmation
               (SSL_HANDSHAKE *hs,Span<unsigned_char> out,Span<const_unsigned_char> client_random,
               SSLTranscript *transcript,bool is_hrr,Span<const_unsigned_char> msg,size_t offset)

{
  string_view label;
  Span<const_unsigned_char> hash;
  Span<unsigned_char> out_00;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  env_md_ctx_st *ctx_00;
  EVP_MD *pEVar4;
  EVP_MD_CTX *pEVar5;
  uchar *puVar6;
  size_t salt_len;
  char *__str;
  Span<unsigned_char> local_1b8;
  uchar *local_1a8;
  size_t sStack_1a0;
  basic_string_view<char,_std::char_traits<char>_> local_198;
  Span<unsigned_char> local_188;
  Span<const_unsigned_char> local_178;
  uchar *local_168;
  size_t sStack_160;
  size_t local_150;
  size_t secret_len;
  uint8_t secret [64];
  undefined1 local_f0 [8];
  ScopedEVP_MD_CTX ctx;
  uchar local_c8 [4];
  uint context_len;
  uint8_t context [64];
  undefined1 local_80 [8];
  Span<const_unsigned_char> after_zeros;
  Span<const_unsigned_char> before_zeros;
  size_t full_header_len;
  Span<const_unsigned_char> header;
  bool is_hrr_local;
  SSLTranscript *transcript_local;
  SSL_HANDSHAKE *hs_local;
  Span<const_unsigned_char> client_random_local;
  Span<unsigned_char> out_local;
  
  client_random_local.size_ = (size_t)out.data_;
  client_random_local.data_ = (uchar *)client_random.size_;
  hs_local = (SSL_HANDSHAKE *)client_random.data_;
  header.size_._7_1_ = is_hrr;
  sVar3 = Span<const_unsigned_char>::size(&msg);
  if (sVar3 < offset + 8) {
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_enc.cc"
                  ,0x290);
    return false;
  }
  _full_header_len = Span<const_unsigned_char>::subspan(&msg,0,4);
  iVar2 = SSL_is_dtls(hs->ssl);
  sVar3 = (ulong)(iVar2 != 0) * 8 + 4;
  join_0x00000010_0x00000000_ = Span<const_unsigned_char>::subspan(&msg,sVar3,offset - sVar3);
  _local_80 = Span<const_unsigned_char>::subspan(&msg,offset + 8,0xffffffffffffffff);
  internal::
  StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
  ::StackAllocatedMovable
            ((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
              *)local_f0);
  ctx_00 = internal::
           StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
           ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                  *)local_f0);
  pEVar4 = SSLTranscript::Digest(transcript);
  bVar1 = SSLTranscript::CopyToHashContext(transcript,ctx_00,pEVar4);
  if (bVar1) {
    pEVar5 = (EVP_MD_CTX *)
             internal::
             StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
             ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                    *)local_f0);
    puVar6 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&full_header_len);
    sVar3 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&full_header_len);
    iVar2 = EVP_DigestUpdate(pEVar5,puVar6,sVar3);
    if (iVar2 != 0) {
      pEVar5 = (EVP_MD_CTX *)
               internal::
               StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
               ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                      *)local_f0);
      puVar6 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&after_zeros.size_);
      sVar3 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&after_zeros.size_);
      iVar2 = EVP_DigestUpdate(pEVar5,puVar6,sVar3);
      if (iVar2 != 0) {
        pEVar5 = (EVP_MD_CTX *)
                 internal::
                 StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                 ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                        *)local_f0);
        iVar2 = EVP_DigestUpdate(pEVar5,"",8);
        if (iVar2 != 0) {
          pEVar5 = (EVP_MD_CTX *)
                   internal::
                   StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                   ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                          *)local_f0);
          puVar6 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)local_80);
          sVar3 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_80);
          iVar2 = EVP_DigestUpdate(pEVar5,puVar6,sVar3);
          if (iVar2 != 0) {
            pEVar5 = (EVP_MD_CTX *)
                     internal::
                     StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                     ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                            *)local_f0);
            iVar2 = EVP_DigestFinal_ex(pEVar5,local_c8,(uint *)((long)&ctx.ctx_.pctx_ops + 4));
            if (iVar2 != 0) {
              pEVar4 = SSLTranscript::Digest(transcript);
              puVar6 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&hs_local);
              sVar3 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&hs_local);
              salt_len = SSLTranscript::DigestLen(transcript);
              iVar2 = HKDF_extract((uint8_t *)&secret_len,&local_150,pEVar4,puVar6,sVar3,"",salt_len
                                  );
              if (iVar2 == 0) {
                out_local.size_._7_1_ = false;
              }
              else {
                sVar3 = Span<unsigned_char>::size((Span<unsigned_char> *)&client_random_local.size_)
                ;
                if (sVar3 != 8) {
                  __assert_fail("out.size() == ECH_CONFIRMATION_SIGNAL_LEN",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_enc.cc"
                                ,0x2b0,
                                "bool bssl::ssl_ech_accept_confirmation(const SSL_HANDSHAKE *, Span<uint8_t>, Span<const uint8_t>, const SSLTranscript &, bool, Span<const uint8_t>, size_t)"
                               );
                }
                local_168 = (uchar *)client_random_local.size_;
                sStack_160 = out.size_;
                pEVar4 = SSLTranscript::Digest(transcript);
                Span<unsigned_char>::Span(&local_188,(uchar *)&secret_len,local_150);
                Span<unsigned_char_const>::
                Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                          ((Span<unsigned_char_const> *)&local_178,&local_188);
                __str = "ech accept confirmation";
                if ((header.size_._7_1_ & 1) != 0) {
                  __str = "hrr ech accept confirmation";
                }
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_198,__str);
                Span<unsigned_char>::Span(&local_1b8,local_c8,(ulong)ctx.ctx_.pctx_ops._4_4_);
                Span<unsigned_char_const>::
                Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                          ((Span<unsigned_char_const> *)&local_1a8,&local_1b8);
                iVar2 = SSL_is_dtls(hs->ssl);
                out_00.size_ = sStack_160;
                out_00.data_ = local_168;
                label._M_str = local_198._M_str;
                label._M_len = local_198._M_len;
                hash.size_ = sStack_1a0;
                hash.data_ = local_1a8;
                out_local.size_._7_1_ =
                     hkdf_expand_label(out_00,pEVar4,local_178,label,hash,iVar2 != 0);
              }
              goto LAB_001cb841;
            }
          }
        }
      }
    }
  }
  out_local.size_._7_1_ = false;
LAB_001cb841:
  internal::
  StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
  ::~StackAllocatedMovable
            ((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
              *)local_f0);
  return out_local.size_._7_1_;
}

Assistant:

bool ssl_ech_accept_confirmation(const SSL_HANDSHAKE *hs, Span<uint8_t> out,
                                 Span<const uint8_t> client_random,
                                 const SSLTranscript &transcript, bool is_hrr,
                                 Span<const uint8_t> msg, size_t offset) {
  // See draft-ietf-tls-esni-13, sections 7.2 and 7.2.1.
  static const uint8_t kZeros[EVP_MAX_MD_SIZE] = {0};

  // We hash |msg|, with bytes from |offset| zeroed.
  if (msg.size() < offset + ECH_CONFIRMATION_SIGNAL_LEN) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  // We represent DTLS messages with the longer DTLS 1.2 header, but DTLS 1.3
  // removes the extra fields from the transcript.
  auto header = msg.subspan(0, SSL3_HM_HEADER_LENGTH);
  size_t full_header_len =
      SSL_is_dtls(hs->ssl) ? DTLS1_HM_HEADER_LENGTH : SSL3_HM_HEADER_LENGTH;
  auto before_zeros = msg.subspan(full_header_len, offset - full_header_len);
  auto after_zeros = msg.subspan(offset + ECH_CONFIRMATION_SIGNAL_LEN);

  uint8_t context[EVP_MAX_MD_SIZE];
  unsigned context_len;
  ScopedEVP_MD_CTX ctx;
  if (!transcript.CopyToHashContext(ctx.get(), transcript.Digest()) ||
      !EVP_DigestUpdate(ctx.get(), header.data(), header.size()) ||
      !EVP_DigestUpdate(ctx.get(), before_zeros.data(), before_zeros.size()) ||
      !EVP_DigestUpdate(ctx.get(), kZeros, ECH_CONFIRMATION_SIGNAL_LEN) ||
      !EVP_DigestUpdate(ctx.get(), after_zeros.data(), after_zeros.size()) ||
      !EVP_DigestFinal_ex(ctx.get(), context, &context_len)) {
    return false;
  }

  uint8_t secret[EVP_MAX_MD_SIZE];
  size_t secret_len;
  if (!HKDF_extract(secret, &secret_len, transcript.Digest(),
                    client_random.data(), client_random.size(), kZeros,
                    transcript.DigestLen())) {
    return false;
  }

  assert(out.size() == ECH_CONFIRMATION_SIGNAL_LEN);
  return hkdf_expand_label(
      out, transcript.Digest(), Span(secret, secret_len),
      is_hrr ? "hrr ech accept confirmation" : "ech accept confirmation",
      Span(context, context_len), SSL_is_dtls(hs->ssl));
}